

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O3

void __thiscall
tyti::stl::
stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser_binary(stl_parser_binary<float,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar1;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar2;
  actor<_f9bcd16b_> that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  that;
  long *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  long local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  undefined1 local_107 [3];
  undefined1 local_104 [4];
  undefined1 local_100 [4];
  undefined1 local_fc [4];
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ****local_f8;
  undefined4 local_f0 [2];
  undefined4 local_e8 [2];
  undefined1 *local_e0;
  undefined1 *local_d8;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_d0;
  undefined1 *local_c8;
  undefined4 *local_c0;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_b8;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_b0;
  undefined1 *local_a8;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_a0;
  undefined4 **local_98;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ***local_90;
  undefined1 **local_88;
  undefined1 *local_80;
  parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined4 *local_60;
  undefined1 **local_58;
  undefined4 **local_50;
  undefined1 **local_48;
  undefined4 ***local_40;
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *****local_38;
  
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"unnamed-grammar","");
  prVar1 = &this->start;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar1;
  local_110 = &(this->
               super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
               ).name_.field_2;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).name_._M_dataplus._M_p = (pointer)local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->
              super_grammar<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
              ).name_,local_130,CONCAT44(uStack_124,local_128) + (long)local_130);
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"unnamed-rule","");
  (this->start).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar1;
  (this->start).name_._M_dataplus._M_p = (pointer)&(this->start).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->start).name_,local_130,
             CONCAT44(uStack_124,local_128) + (long)local_130);
  (this->start).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_solid<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"unnamed-rule","");
  prVar2 = &this->vector;
  (this->vector).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = prVar2;
  (this->vector).name_._M_dataplus._M_p = (pointer)&(this->vector).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->vector).name_,local_130,
             CONCAT44(uStack_124,local_128) + (long)local_130);
  (this->vector).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"unnamed-rule","");
  (this->endSolid).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = &this->endSolid;
  (this->endSolid).name_._M_dataplus._M_p = (pointer)&(this->endSolid).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->endSolid).name_,local_130,
             CONCAT44(uStack_124,local_128) + (long)local_130);
  (this->endSolid).f.
  super_function4<bool,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::spirit::unused_type_&,_boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::fusion::nil_>_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<tyti::stl::basic_vec3<float>&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)&(this->vector).f,
              (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&local_130);
  local_60 = local_e8;
  local_e8[0] = 0x50;
  local_58 = &local_70;
  local_70 = &boost::spirit::byte_;
  local_68 = local_107;
  local_50 = &local_60;
  local_128 = 3;
  local_48 = &local_80;
  local_80 = &boost::spirit::little_dword;
  local_40 = &local_50;
  local_a0 = &local_b0;
  local_a8 = local_fc;
  local_c0 = local_f0;
  local_f0[0] = 3;
  local_b8 = &local_d0;
  local_c8 = local_100;
  local_98 = &local_c0;
  local_90 = &local_a0;
  local_88 = &local_e0;
  local_e0 = &boost::spirit::little_word;
  local_d8 = local_104;
  local_f8 = &local_90;
  local_38 = &local_f8;
  local_d0 = prVar2;
  local_b0 = prVar2;
  local_78 = (parser_binder<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::cons<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::floating_point<32>,_(boost::endian::order)1,_32>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
              *)&local_130;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<float>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_b72d52aa_>(prVar1);
  return;
}

Assistant:

stl_parser_binary() : stl_parser_binary::base_type(start)
            {
                namespace spirit = boost::spirit;
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace px = boost::phoenix;

                vector %= spirit::little_bin_float >> spirit::little_bin_float >> spirit::little_bin_float;

                start =
                    qi::repeat(80)[spirit::byte_[px::at_c<0>(ql::_val) += ql::_1]]              //80x8-bit header
                    >> spirit::little_dword[px::reserve(px::at_c<1>(ql::_val), ql::_1),
                    px::reserve(px::at_c<2>(ql::_val), 3 * ql::_1),
                    px::reserve(px::at_c<3>(ql::_val), ql::_1)]    //# of triangles
                    >> *(vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]  //normal
                        >> spirit::repeat(3)[vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]] //vertices
                        >> spirit::little_word[px::push_back(px::at_c<3>(ql::_val), ql::_1)]  //attribute
                        )
                    //end
                    ;
            }